

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O3

void wipeout_text(char *engr,int cnt,uint seed)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  long lVar6;
  char cVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  char *__s;
  
  uVar10 = (ulong)seed;
  sVar3 = strlen(engr);
  iVar2 = (int)sVar3;
  if (0 < cnt && iVar2 != 0) {
    do {
      if ((int)uVar10 == 0) {
        uVar9 = mt_random();
        uVar10 = 0;
        iVar11 = SUB164(ZEXT416(uVar9) % SEXT816((long)iVar2),0);
        uVar9 = mt_random();
      }
      else {
        iVar11 = (int)(uVar10 % (sVar3 & 0xffffffff));
        uVar9 = (int)uVar10 * 0x1f;
        uVar9 = uVar9 / 0xff + (uVar9 / 0xff) * -0x100 + uVar9;
        uVar10 = (ulong)uVar9;
      }
      cVar1 = engr[iVar11];
      if (cVar1 != 0x20) {
        pvVar4 = memchr("?.,\'`-|_",(int)cVar1,9);
        cVar7 = ' ';
        if ((pvVar4 == (void *)0x0) && (cVar7 = '?', (uVar9 & 3) != 0)) {
          lVar6 = 8;
          do {
            if (cVar1 == *(char *)((long)ends + lVar6 + 0x88)) {
              if ((int)uVar10 == 0) {
                __s = *(char **)(&rubouts[0].wipefrom + lVar6);
                sVar5 = strlen(__s);
                uVar9 = mt_random();
                uVar10 = 0;
                uVar8 = SUB168(ZEXT416(uVar9) % SEXT816((long)(int)sVar5),0);
              }
              else {
                uVar9 = (int)uVar10 * 0x1f;
                uVar10 = (ulong)(uVar9 / 0xff + (uVar9 / 0xff) * -0x100 + uVar9);
                __s = *(char **)(&rubouts[0].wipefrom + lVar6);
                sVar5 = strlen(__s);
                uVar8 = uVar10 % sVar5;
              }
              cVar7 = __s[uVar8];
              break;
            }
            lVar6 = lVar6 + 0x10;
          } while (lVar6 != 0x2b8);
        }
        engr[iVar11] = cVar7;
      }
      cnt = cnt + -1;
    } while (cnt != 0);
  }
  if (iVar2 != 0) {
    lVar6 = (long)iVar2;
    do {
      if (engr[lVar6 + -1] != ' ') {
        return;
      }
      engr[lVar6 + -1] = '\0';
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return;
}

Assistant:

void wipeout_text(char *engr,
		  int cnt,
		  unsigned seed) /* for semi-controlled randomization */
{
	char *s;
	int i, j, nxt, use_rubout, lth = (int)strlen(engr);

	if (lth && cnt > 0) {
	    while (cnt--) {
		/* pick next character */
		if (!seed) {
		    /* random */
		    nxt = rn2(lth);
		    use_rubout = rn2(4);
		} else {
		    /* predictable; caller can reproduce the same sequence by
		       supplying the same arguments later, or a pseudo-random
		       sequence by varying any of them */
		    nxt = seed % lth;
		    seed *= 31,  seed %= (BUFSZ-1);
		    use_rubout = seed & 3;
		}
		s = &engr[nxt];
		if (*s == ' ') continue;

		/* rub out unreadable & small punctuation marks */
		if (strchr("?.,'`-|_", *s)) {
		    *s = ' ';
		    continue;
		}

		if (!use_rubout)
		    i = SIZE(rubouts);
		else
		    for (i = 0; i < SIZE(rubouts); i++)
			if (*s == rubouts[i].wipefrom) {
			    /*
			     * Pick one of the substitutes at random.
			     */
			    if (!seed)
				j = rn2(strlen(rubouts[i].wipeto));
			    else {
				seed *= 31,  seed %= (BUFSZ-1);
				j = seed % (strlen(rubouts[i].wipeto));
			    }
			    *s = rubouts[i].wipeto[j];
			    break;
			}

		/* didn't pick rubout; use '?' for unreadable character */
		if (i == SIZE(rubouts)) *s = '?';
	    }
	}

	/* trim trailing spaces */
	while (lth && engr[lth-1] == ' ') engr[--lth] = 0;
}